

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType nValence,DoublePolynomial *vs
          )

{
  bool bVar1;
  undefined8 *in_RDI;
  FluctuatingAtypeParameters fqParam;
  string *in_stack_ffffffffffffff18;
  AtomType *in_stack_ffffffffffffff20;
  shared_ptr<OpenMD::GenericData> *this_00;
  FluctuatingAtypeParameters *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> local_b0 [2];
  undefined8 local_90;
  undefined1 local_88;
  undefined1 local_87;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  shared_ptr<OpenMD::GenericData> *genData;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  
  bVar1 = isFluctuatingCharge((FluctuatingChargeAdapter *)0x29c140);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  local_90 = 0;
  local_88 = 0;
  local_87 = 0;
  local_80 = 0;
  local_78 = 0;
  local_70 = 0;
  genData = (shared_ptr<OpenMD::GenericData> *)0x0;
  uVar2 = 0;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x29c1bd);
  local_87 = 0;
  local_88 = 1;
  Polynomial<double>::operator=
            ((Polynomial<double> *)in_stack_ffffffffffffff20,
             (Polynomial<double> *)in_stack_ffffffffffffff18);
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,void>(this_00,local_b0);
  AtomType::addProperty((AtomType *)CONCAT44(in_stack_ffffffffffffffa4,uVar2),genData);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x29c257);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)0x29c261);
  FluctuatingAtypeParameters::~FluctuatingAtypeParameters((FluctuatingAtypeParameters *)0x29c26b);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(RealType chargeMass,
                                                       RealType nValence,
                                                       DoublePolynomial vs) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};

    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = false;

    // old-style EAMPoly has nV = nM
    fqParam.isMetallic = true;
    fqParam.nValence   = nValence;
    fqParam.nMobile    = nValence;

    fqParam.vself = vs;

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }